

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinterinfo.cpp
# Opt level: O3

QList<QPrinter::ColorMode> * __thiscall
QPrinterInfo::supportedColorModes
          (QList<QPrinter::ColorMode> *__return_storage_ptr__,QPrinterInfo *this)

{
  QPrintDevice *this_00;
  ColorMode *pCVar1;
  QList<QPrint::ColorMode> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QList<QPrint::ColorMode> local_58;
  ColorMode local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &((this->d_ptr).d)->m_printDevice;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (ColorMode *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d.size = -0x5555555555555556;
  local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.d.ptr = (ColorMode *)0xaaaaaaaaaaaaaaaa;
  QPrintDevice::supportedColorModes(&local_58,this_00);
  QList<QPrinter::ColorMode>::reserve(__return_storage_ptr__,local_58.d.size);
  pCVar1 = local_58.d.ptr;
  if (local_58.d.size != 0) {
    lVar3 = local_58.d.size << 2;
    lVar2 = 0;
    do {
      local_34 = *(ColorMode *)((long)pCVar1 + lVar2);
      QtPrivate::QPodArrayOps<QPrinter::ColorMode>::emplace<QPrinter::ColorMode&>
                ((QPodArrayOps<QPrinter::ColorMode> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_34);
      QList<QPrinter::ColorMode>::end(__return_storage_ptr__);
      lVar2 = lVar2 + 4;
    } while (lVar3 != lVar2);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPrinter::ColorMode> QPrinterInfo::supportedColorModes() const
{
    Q_D(const QPrinterInfo);
    QList<QPrinter::ColorMode> list;
    const auto supportedColorModes = d->m_printDevice.supportedColorModes();
    list.reserve(supportedColorModes.size());
    for (QPrint::ColorMode mode : supportedColorModes)
        list << QPrinter::ColorMode(mode);
    return list;
}